

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O2

void websocket_on_unwrapped
               (void *ws_p,void *msg,uint64_t len,char first,char last,char text,uchar rsv)

{
  code *pcVar1;
  FIOBJ str;
  fio_str_info_s local_38;
  
  if (first == '\0' || last == '\0') {
    if (first != '\0') {
      *(char *)((long)ws_p + 0xb0) = text;
      str = *(FIOBJ *)((long)ws_p + 0xa8);
      if (str == 0) {
        str = fiobj_str_buf(len);
        *(FIOBJ *)((long)ws_p + 0xa8) = str;
      }
      fiobj_str_resize(str,0);
    }
    fiobj_str_write(*(FIOBJ *)((long)ws_p + 0xa8),(char *)msg,len);
    if (last != '\0') {
      pcVar1 = *(code **)((long)ws_p + 0x38);
      fiobj_obj2cstr(&local_38,*(FIOBJ *)((long)ws_p + 0xa8));
      (*pcVar1)(ws_p,*(undefined1 *)((long)ws_p + 0xb0));
    }
  }
  else {
    (**(code **)((long)ws_p + 0x38))(ws_p,text);
  }
  return;
}

Assistant:

static void websocket_on_unwrapped(void *ws_p, void *msg, uint64_t len,
                                   char first, char last, char text,
                                   unsigned char rsv) {
  ws_s *ws = ws_p;
  if (last && first) {
    ws->on_message(ws, (fio_str_info_s){.data = msg, .len = len},
                   (uint8_t)text);
    return;
  }
  if (first) {
    ws->is_text = (uint8_t)text;
    if (ws->msg == FIOBJ_INVALID)
      ws->msg = fiobj_str_buf(len);
    fiobj_str_resize(ws->msg, 0);
  }
  fiobj_str_write(ws->msg, msg, len);
  if (last) {
    ws->on_message(ws, fiobj_obj2cstr(ws->msg), ws->is_text);
  }

  (void)rsv;
}